

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StructGet *curr)

{
  pointer pFVar1;
  Struct *pSVar2;
  ulong uVar3;
  Literal *other;
  shared_ptr<wasm::GCData> sVar4;
  undefined1 local_c8 [8];
  Flow ref;
  undefined1 auStack_78 [8];
  value_type field;
  Literal local_50;
  undefined1 local_38 [8];
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_c8,this,curr->ref);
  if (ref.breakTo.super_IString.str._M_len == 0) {
    Flow::getSingleValue((Flow *)local_c8);
    sVar4 = Literal::getGCData((Literal *)local_38);
    if (local_38 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])
                (this,"null ref",
                 sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
    }
    ref.breakTo.super_IString.str._M_str = (char *)wasm::Type::getHeapType(&curr->ref->type);
    pSVar2 = HeapType::getStruct((HeapType *)&ref.breakTo.super_IString.str._M_str);
    uVar3 = (ulong)curr->index;
    pFVar1 = (pSVar2->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start + uVar3;
    auStack_78 = (undefined1  [8])(pFVar1->type).id;
    field.type.id._0_4_ = pFVar1->packedType;
    field.type.id._4_4_ = pFVar1->mutable_;
    other = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar3 - 1);
    if (uVar3 == 0) {
      other = (((Literals *)((long)local_38 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
              _M_elems;
    }
    Literal::Literal(&local_50,other);
    extendForPacking((Literal *)&field.packedType,this,&local_50,(Field *)auStack_78,curr->signed_);
    Flow::Flow(__return_storage_ptr__,(Literal *)&field.packedType);
    Literal::~Literal((Literal *)&field.packedType);
    Literal::~Literal(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_c8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructGet(StructGet* curr) {
    NOTE_ENTER("StructGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    return extendForPacking(data->values[curr->index], field, curr->signed_);
  }